

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-option-parser.cc
# Opt level: O0

void __thiscall
OptionParser_OneOrMoreArguments_Test::~OptionParser_OneOrMoreArguments_Test
          (OptionParser_OneOrMoreArguments_Test *this)

{
  OptionParser_OneOrMoreArguments_Test *this_local;
  
  ~OptionParser_OneOrMoreArguments_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OptionParser, OneOrMoreArguments) {
  std::string argument;
  OptionParser parser("prog", "desc");
  parser.AddArgument("arg", OptionParser::ArgumentCount::OneOrMore,
                     [&](const char* arg) { argument += arg; });
  const char* args[] = {"prog name", "hello", "goodbye"};
  parser.Parse(3, const_cast<char**>(args));
  EXPECT_EQ("hellogoodbye", argument);
}